

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_peer.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::ipv6_peer::ipv6_peer(ipv6_peer *this,endpoint *ep,bool c,peer_source_flags_t src)

{
  ushort uVar1;
  bool bVar2;
  address local_48;
  anon_union_16_3_a3f0114d_for___in6_u local_28;
  
  uVar1 = (ep->impl_).data_.v4.sin_port;
  torrent_peer::torrent_peer(&this->super_torrent_peer,uVar1 << 8 | uVar1 >> 8,c,src);
  bVar2 = (ep->impl_).data_.base.sa_family != 2;
  if (bVar2) {
    local_48.ipv6_address_.addr_.__in6_u._0_8_ = *(undefined8 *)((long)&(ep->impl_).data_ + 8);
    local_48.ipv6_address_.addr_.__in6_u._8_8_ = *(undefined8 *)((long)&(ep->impl_).data_ + 0x10);
    local_48.ipv6_address_.scope_id_ = (unsigned_long)(ep->impl_).data_.v6.sin6_scope_id;
    local_48.ipv4_address_.addr_.s_addr = (in4_addr_type)0;
  }
  else {
    local_48.ipv4_address_.addr_.s_addr = (in4_addr_type)(ep->impl_).data_.v4.sin_addr.s_addr;
    local_48.ipv6_address_.addr_.__in6_u._0_8_ = 0;
    local_48.ipv6_address_.addr_.__in6_u._8_8_ = 0;
    local_48.ipv6_address_.scope_id_ = 0;
  }
  local_48.type_ = (anon_enum_32)bVar2;
  boost::asio::ip::address::to_v6((address_v6 *)&local_28,&local_48);
  *(undefined8 *)(this->addr)._M_elems = local_28._0_8_;
  *(undefined8 *)((this->addr)._M_elems + 8) = local_28._8_8_;
  *(uint *)&(this->super_torrent_peer).field_0x1b =
       *(uint *)&(this->super_torrent_peer).field_0x1b & 0xfcffffff | 0x1000000;
  return;
}

Assistant:

ipv6_peer::ipv6_peer(tcp::endpoint const& ep, bool c
		, peer_source_flags_t const src)
		: torrent_peer(ep.port(), c, src)
		, addr(ep.address().to_v6().to_bytes())
	{
		is_v6_addr = true;
#if TORRENT_USE_I2P
		is_i2p_addr = false;
#endif
#if TORRENT_USE_RTC
		is_rtc_addr = false;
#endif
	}